

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O3

void __thiscall M_tree::M_tree(M_tree *this)

{
  this->_vptr_M_tree = (_func_int **)&PTR__M_tree_0010ad88;
  memset(&this->file_names_p,0,0x90);
  (this->folder_name1)._M_dataplus._M_p = (pointer)&(this->folder_name1).field_2;
  (this->folder_name1)._M_string_length = 0;
  (this->folder_name1).field_2._M_local_buf[0] = '\0';
  (this->folder_name2)._M_dataplus._M_p = (pointer)&(this->folder_name2).field_2;
  (this->folder_name2)._M_string_length = 0;
  (this->folder_name2).field_2._M_local_buf[0] = '\0';
  this->treesize = 0;
  this->pNode = (Node *)0x0;
  this->oldpNode = (Node *)0x0;
  this->ofolder = (Node *)0x0;
  return;
}

Assistant:

M_tree::M_tree() {
    this->treesize = 0;
    this->pNode = NULL;
    this->oldpNode = NULL;
    this->ofolder = NULL;
}